

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

int ordinal_index(int n)

{
  int iVar1;
  int lastdig;
  int n_local;
  undefined4 local_4;
  
  local_4 = n % 10;
  if (((local_4 == 0) || (3 < local_4)) || ((10 < n && (n < 0x14)))) {
    local_4 = 3;
  }
  else {
    iVar1 = 3;
    if (n < 10) {
      iVar1 = -1;
    }
    local_4 = local_4 + iVar1;
  }
  return local_4;
}

Assistant:

static int ordinal_index(int n)
{
    /* get the last digit */
    int lastdig = n % 10;

    /* 
     *   if it's in the teens, or the last digit is 0 or 4-9, use the generic
     *   Nth suffix 
     */
    if (lastdig == 0 || lastdig >= 4 || (n > 10 && n < 20))
        return 3;

    /* if it's in the 1-3 range, use 1st/2nd/3rd; otherwise use X1st/etc */
    return lastdig + (n < 10 ? -1 : 3);
}